

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O3

void __thiscall polyscope::SlicePlane::buildGUI(SlicePlane *this)

{
  float fVar1;
  undefined8 uVar2;
  mapped_type mVar3;
  size_t __n;
  ulong uVar4;
  undefined1 auVar5 [16];
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar6;
  float fVar7;
  bool bVar8;
  int iVar9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  iterator iVar13;
  mapped_type *pmVar14;
  _Base_ptr p_Var15;
  _Rb_tree_header *p_Var16;
  undefined1 auVar17 [16];
  string vMeshName;
  undefined1 local_b0 [12];
  float fStack_a4;
  undefined1 local_a0 [20];
  float local_8c;
  string local_88;
  ImVec2 local_68;
  undefined8 uStack_60;
  string local_50;
  
  ImGui::PushID((this->name)._M_dataplus._M_p);
  bVar8 = ImGui::Checkbox((this->name)._M_dataplus._M_p,&(this->active).value);
  if (bVar8) {
    setActive(this,(this->active).value);
  }
  ImGui::SameLine(0.0,-1.0);
  local_b0._0_4_ = (this->color).value.field_0;
  local_b0._4_4_ = (this->color).value.field_1;
  local_b0._8_4_ = (this->color).value.field_2.z;
  fVar1 = (this->transparency).value;
  uStack_60 = 0;
  fStack_a4 = fVar1;
  local_8c = (float)local_b0._8_4_;
  local_68 = (ImVec2)local_b0._0_8_;
  bVar8 = ImGui::ColorEdit4("##color and trans",(float *)local_b0,0x20);
  if (!bVar8) goto LAB_00237762;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_b0._0_8_;
  auVar5._8_8_ = uStack_60;
  auVar5._0_4_ = local_68.x;
  auVar5._4_4_ = local_68.y;
  uVar4 = vcmpps_avx512vl(auVar17,auVar5,4);
  if (((uVar4 & 1) == 0) && ((uVar4 >> 1 & 1) == 0)) {
    if (((float)local_b0._8_4_ != local_8c) || (NAN((float)local_b0._8_4_) || NAN(local_8c)))
    goto LAB_002376d8;
  }
  else {
LAB_002376d8:
    uVar2 = vmovlps_avx(auVar17);
    (this->color).value.field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar2;
    (this->color).value.field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar2 >> 0x20)
    ;
    (this->color).value.field_2.z = (float)local_b0._8_4_;
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&detail::persistentCache_glmvec3,&(this->color).name);
    aVar6 = (this->color).value.field_1;
    pmVar10->field_0 = (this->color).value.field_0;
    pmVar10->field_1 = aVar6;
    pmVar10->field_2 = (this->color).value.field_2;
    (this->color).holdsDefaultValue = false;
    requestRedraw();
  }
  fVar7 = fStack_a4;
  if ((fStack_a4 != fVar1) || (NAN(fStack_a4) || NAN(fVar1))) {
    (this->transparency).value = fStack_a4;
    pmVar11 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&detail::persistentCache_float,&(this->transparency).name);
    *pmVar11 = fVar7;
    (this->transparency).holdsDefaultValue = false;
    requestRedraw();
  }
LAB_00237762:
  ImGui::Indent(16.0);
  bVar8 = ImGui::Checkbox("draw plane",&(this->drawPlane).value);
  if (bVar8) {
    mVar3 = (this->drawPlane).value;
    pmVar12 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&detail::persistentCache_bool,&(this->drawPlane).name);
    *pmVar12 = mVar3;
    (this->drawPlane).holdsDefaultValue = false;
    requestRedraw();
  }
  ImGui::SameLine(0.0,-1.0);
  bVar8 = ImGui::Checkbox("draw widget",&(this->drawWidget).value);
  if (bVar8) {
    setDrawWidget(this,(this->drawWidget).value);
  }
  local_b0._0_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Volume Mesh","");
  iVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>_>
                   *)state::structures_abi_cxx11_,(key_type *)local_b0);
  if ((undefined1 *)local_b0._0_8_ != local_a0) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (iVar13._M_node != (_Base_ptr)(state::structures_abi_cxx11_ + 8)) {
    local_b0._0_4_ = 0.0;
    local_b0._4_4_ = 0.0;
    bVar8 = ImGui::Button("Inspect",(ImVec2 *)local_b0);
    if (bVar8) {
      ImGui::OpenPopup("InspectPopup",0);
    }
    bVar8 = ImGui::BeginPopup("InspectPopup",0);
    if (bVar8) {
      local_b0._0_8_ = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Volume Mesh","");
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>_>
                              *)state::structures_abi_cxx11_,(key_type *)local_b0);
      if ((undefined1 *)local_b0._0_8_ != local_a0) {
        operator_delete((void *)local_b0._0_8_);
      }
      p_Var15 = (pmVar14->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var16 = &(pmVar14->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var15 != p_Var16) {
        do {
          local_b0._0_8_ = local_a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b0,*(long *)(p_Var15 + 1),
                     (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
          uVar2 = local_b0._0_8_;
          __n = (this->inspectedMeshName)._M_string_length;
          if (__n == CONCAT44(fStack_a4,local_b0._8_4_)) {
            if (__n == 0) {
              bVar8 = true;
            }
            else {
              iVar9 = bcmp((this->inspectedMeshName)._M_dataplus._M_p,(void *)local_b0._0_8_,__n);
              bVar8 = iVar9 == 0;
            }
          }
          else {
            bVar8 = false;
          }
          bVar8 = ImGui::MenuItem((char *)uVar2,(char *)0x0,bVar8,true);
          if (bVar8) {
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,local_b0._0_8_,
                       (char *)(CONCAT44(fStack_a4,local_b0._8_4_) + local_b0._0_8_));
            setVolumeMeshToInspect(this,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p);
            }
          }
          if ((undefined1 *)local_b0._0_8_ != local_a0) {
            operator_delete((void *)local_b0._0_8_);
          }
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
        } while ((_Rb_tree_header *)p_Var15 != p_Var16);
      }
      iVar9 = std::__cxx11::string::compare((char *)&this->inspectedMeshName);
      bVar8 = ImGui::MenuItem("None",(char *)0x0,iVar9 == 0,true);
      if (bVar8) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
        setVolumeMeshToInspect(this,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      ImGui::EndPopup();
    }
  }
  ImGui::Unindent(16.0);
  ImGui::PopID();
  return;
}

Assistant:

void SlicePlane::buildGUI() {
  ImGui::PushID(name.c_str());

  if (ImGui::Checkbox(name.c_str(), &active.get())) {
    setActive(getActive());
  }

  ImGui::SameLine();

  { // Color transparency box
    // Pack the color & transparency in to a vec4
    glm::vec3 colorBefore = getColor();
    float transparencyBefore = getTransparency();
    std::array<float, 4> color{colorBefore.x, colorBefore.y, colorBefore.z, transparencyBefore};
    if (ImGui::ColorEdit4("##color and trans", &color[0], ImGuiColorEditFlags_NoInputs)) {
      if (color[0] != colorBefore[0] || color[1] != colorBefore[1] || color[2] != colorBefore[2]) {
        setColor(glm::vec3{color[0], color[1], color[2]});
      }
      if (color[3] != transparencyBefore) {
        setTransparency(color[3]);
      }
    }
  }

  ImGui::Indent(16.);
  if (ImGui::Checkbox("draw plane", &drawPlane.get())) {
    setDrawPlane(getDrawPlane());
  }
  ImGui::SameLine();
  if (ImGui::Checkbox("draw widget", &drawWidget.get())) {
    setDrawWidget(getDrawWidget());
  }

  bool haveVolumeMeshes = state::structures.find("Volume Mesh") != state::structures.end();

  if (haveVolumeMeshes) {

    if (ImGui::Button("Inspect")) {
      ImGui::OpenPopup("InspectPopup");
    }
    if (ImGui::BeginPopup("InspectPopup")) {

      //  Loop over volume meshes and offer them to be inspected
      for (std::pair<const std::string, std::unique_ptr<Structure>>& it : state::structures["Volume Mesh"]) {
        std::string vMeshName = it.first;
        if (ImGui::MenuItem(vMeshName.c_str(), NULL, inspectedMeshName == vMeshName)) {
          setVolumeMeshToInspect(vMeshName);
        }
      }

      // "None" option
      if (ImGui::MenuItem("None", NULL, inspectedMeshName == "")) {
        setVolumeMeshToInspect("");
      }

      ImGui::EndPopup();
    }
  }


  ImGui::Unindent(16.);

  ImGui::PopID();
}